

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

HTS_Boolean
HTS_get_token_from_string_with_separator(char *str,size_t *index,char *buff,char separator)

{
  size_t sVar1;
  size_t sVar2;
  char cVar3;
  long lVar4;
  
  if (str != (char *)0x0) {
    cVar3 = str[*index];
    sVar2 = *index;
    if (cVar3 != '\0') {
      while( true ) {
        if (cVar3 != separator) {
          lVar4 = 0;
          while ((cVar3 != separator && (cVar3 != '\0'))) {
            buff[lVar4] = cVar3;
            lVar4 = lVar4 + 1;
            sVar1 = *index;
            sVar2 = sVar1 + 1;
            *index = sVar2;
            cVar3 = str[sVar1 + 1];
          }
          if (cVar3 != '\0') {
            *index = sVar2 + 1;
          }
          buff[lVar4] = '\0';
          return lVar4 != 0;
        }
        if (separator == '\0') break;
        *index = sVar2 + 1;
        cVar3 = str[sVar2 + 1];
        sVar2 = sVar2 + 1;
      }
    }
  }
  return '\0';
}

Assistant:

HTS_Boolean HTS_get_token_from_string_with_separator(const char *str, size_t * index, char *buff, char separator)
{
   char c;
   size_t len = 0;

   if (str == NULL)
      return FALSE;

   c = str[(*index)];
   if (c == '\0')
      return FALSE;
   while (c == separator) {
      if (c == '\0')
         return FALSE;
      (*index)++;
      c = str[(*index)];
   }
   while (c != separator && c != '\0') {
      buff[len++] = c;
      (*index)++;
      c = str[(*index)];
   }
   if (c != '\0')
      (*index)++;

   buff[len] = '\0';

   if (len > 0)
      return TRUE;
   else
      return FALSE;
}